

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_merge_parent_children(lyd_node *target,lyd_node *source,int options)

{
  ushort uVar1;
  LYS_NODE LVar2;
  ly_ctx *ctx;
  lyd_node *plVar3;
  lys_node *plVar4;
  int iVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  lyd_node *node;
  lyd_node *unaff_R12;
  lyd_node *plVar8;
  bool bVar9;
  long *local_60;
  lyd_node **trg_child_p;
  lyd_node *local_50;
  lyd_node *local_48;
  lyd_node *local_40;
  lyd_node *local_38;
  
  if (source == (lyd_node *)0x0) {
    iVar5 = 0;
    plVar8 = (lyd_node *)0x0;
  }
  else {
    ctx = target->schema->module->ctx;
    trg_child_p = (lyd_node **)0x0;
    local_48 = source;
    do {
      plVar3 = source->next;
      node = source;
      plVar6 = target;
      do {
        local_40 = node;
        if ((((uint)options >> 8 & 1) == 0) || ((node->field_0x9 & 1) == 0)) {
          if (node->hash == 0) {
            lyd_hash(node);
          }
          if (plVar6->ht == (hash_table *)0x0) {
            for (local_38 = plVar6->child; local_38 != (lyd_node *)0x0; local_38 = local_38->next) {
              iVar5 = lyd_merge_node_schema_equal(local_38,local_40);
              if (iVar5 == 1) {
                iVar5 = lyd_merge_node_equal(local_38,local_40);
              }
              if (iVar5 != 0) {
                if (0 < iVar5) {
                  bVar9 = iVar5 == 2;
                  goto LAB_00167cd9;
                }
                if (iVar5 == -1) {
                  iVar5 = 1;
                  plVar8 = local_48;
                  goto LAB_00167edb;
                }
                break;
              }
            }
          }
          else {
            local_38 = (lyd_node *)0x0;
            iVar5 = lyht_find(plVar6->ht,&local_40,local_40->hash,&local_60);
            if (iVar5 == 0) {
              local_38 = (lyd_node *)*local_60;
              plVar4 = local_38->schema;
              if (plVar4->nodetype == LYS_LEAFLIST) {
                uVar1 = plVar4->flags;
                if ((uVar1 & 2) == 0) goto LAB_00167cd7;
              }
              else {
                if ((plVar4->nodetype != LYS_LIST) || (plVar4->padding[2] != '\0')) {
LAB_00167cd7:
                  bVar9 = false;
LAB_00167cd9:
                  if ((local_38->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) == LYS_UNKNOWN) {
                    trg_child_p = (lyd_node **)((ulong)trg_child_p & 0xffffffff);
                    if (bVar9) {
                      trg_child_p = (lyd_node **)0x1;
                    }
                  }
                  else {
                    lyd_merge_node_update(local_38,local_40);
                  }
                  goto LAB_00167d5e;
                }
                uVar1 = plVar4->flags;
              }
              if ((uVar1 & 2) == 0) {
                __assert_fail("trg_child->schema->flags & LYS_CONFIG_R",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0xacd,
                              "int lyd_merge_parent_children(struct lyd_node *, struct lyd_node *, int)"
                             );
              }
              do {
                if (-1 < (char)local_38->validity) {
                  local_38->validity = local_38->validity | 0x80;
                  bVar9 = true;
                  goto LAB_00167cd9;
                }
                iVar5 = lyht_find_next(plVar6->ht,&local_38,local_38->hash,&local_60);
                if (iVar5 != 0) {
                  local_38 = (lyd_node *)0x0;
                  break;
                }
                local_38 = (lyd_node *)*local_60;
              } while (local_38 != (lyd_node *)0x0);
            }
          }
LAB_00167d5e:
          LVar2 = local_40->schema->nodetype;
          unaff_R12 = local_40;
          local_50 = plVar6;
          if (((LVar2 != LYS_CONTAINER) &&
              ((LVar2 != LYS_LIST || (local_40->schema->padding[2] == '\0')))) ||
             (node = local_40->child, plVar7 = local_38,
             node == (lyd_node *)0x0 || local_38 == (lyd_node *)0x0)) goto LAB_00167daa;
        }
        else {
          if (node == source) break;
          local_38 = (lyd_node *)0x1;
LAB_00167daa:
          if (local_40 == source) {
            if (local_38 != (lyd_node *)0x0) break;
            node = (lyd_node *)0x0;
          }
          else {
            node = local_40->next;
            if (node == (lyd_node *)0x0) {
              plVar8 = local_40->parent;
              do {
                local_40 = plVar8;
                if (local_40->parent == source->parent) {
                  node = (lyd_node *)0x0;
                  break;
                }
                node = local_40->next;
                plVar6 = plVar6->parent;
                plVar8 = local_40->parent;
              } while (node == (lyd_node *)0x0);
            }
            plVar7 = plVar6;
            if (local_38 != (lyd_node *)0x0) goto LAB_00167e56;
          }
          if (ctx == unaff_R12->schema->module->ctx) {
            lyd_unlink_internal(unaff_R12,1);
          }
          else {
            unaff_R12 = lyd_dup_to_ctx(unaff_R12,1,ctx);
          }
          plVar8 = local_48;
          if (local_40 == local_48) {
            plVar8 = local_48->next;
          }
          iVar5 = lyd_insert(local_50,unaff_R12);
          if (iVar5 != 0) {
            ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                   ,0xb36);
            iVar5 = 1;
            goto LAB_00167edb;
          }
          plVar7 = plVar6;
          local_48 = plVar8;
          if (local_40 == source) break;
        }
LAB_00167e56:
        plVar6 = plVar7;
        local_40 = node;
      } while (node != (lyd_node *)0x0);
      source = plVar3;
    } while (plVar3 != (lyd_node *)0x0);
    iVar5 = (uint)((int)trg_child_p != 0) * 2;
    plVar8 = local_48;
  }
LAB_00167edb:
  lyd_free_withsiblings(plVar8);
  return iVar5;
}

Assistant:

static int
lyd_merge_parent_children(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg_parent, *src, *src_backup, *src_elem, *src_elem_backup, *src_next, *trg_child, *trg_parent_backup;
    int ret, clear_flag = 0;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        for (src_elem = src_next = src, trg_parent = target;
            src_elem;
            src_elem = src_next) {

            /* it won't get inserted in this case */
            if (src_elem->dflt && (options & LYD_OPT_EXPLICIT)) {
                if (src_elem == src) {
                    /* we are done with this subtree in this case */
                    break;
                }
                trg_child = (struct lyd_node *)1;
                goto src_skip;
            }

            ret = 0;

#ifdef LY_ENABLED_CACHE
            struct lyd_node **trg_child_p;

            /* trees are supposed to be validated so all nodes must have their hash, but lets not be that strict */
            if (!src_elem->hash) {
                lyd_hash(src_elem);
            }

            if (trg_parent->ht) {
                trg_child = NULL;
                if (!lyht_find(trg_parent->ht, &src_elem, src_elem->hash, (void **)&trg_child_p)) {
                    trg_child = *trg_child_p;
                    ret = 1;

                    /* it is a bit more difficult with keyless state lists and leaf-lists */
                    if (((trg_child->schema->nodetype == LYS_LIST) && !((struct lys_node_list *)trg_child->schema)->keys_size)
                            || ((trg_child->schema->nodetype == LYS_LEAFLIST) && (trg_child->schema->flags & LYS_CONFIG_R))) {
                        assert(trg_child->schema->flags & LYS_CONFIG_R);

                        while (trg_child && (trg_child->validity & LYD_VAL_INUSE)) {
                            /* state lists, find one not-already-found */
                            if (lyht_find_next(trg_parent->ht, &trg_child, trg_child->hash, (void **)&trg_child_p)) {
                                trg_child = NULL;
                            } else {
                                trg_child = *trg_child_p;
                            }
                        }
                        if (trg_child) {
                            /* mark it as matched */
                            trg_child->validity |= LYD_VAL_INUSE;
                            ret = 2;
                        } else {
                            /* actually, it was matched already and no other instance found, so now not a match */
                            ret = 0;
                        }
                    }
                }
            } else
#endif
            {
                LY_TREE_FOR(trg_parent->child, trg_child) {
                    /* schema match, data match? */
                    ret = lyd_merge_node_schema_equal(trg_child, src_elem);
                    if (ret == 1) {
                        ret = lyd_merge_node_equal(trg_child, src_elem);
                    }
                    if (ret != 0) {
                        /* even data match */
                        break;
                    }
                }
            }

            if (ret > 0) {
                if (trg_child->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) {
                    lyd_merge_node_update(trg_child, src_elem);
                } else if (ret == 2) {
                    clear_flag = 1;
                }
            } else if (ret == -1) {
                /* error */
                lyd_free_withsiblings(source);
                return 1;
            }

            /* first prepare for the next iteration */
            src_elem_backup = src_elem;
            trg_parent_backup = trg_parent;
            if (((src_elem->schema->nodetype == LYS_CONTAINER) || ((src_elem->schema->nodetype == LYS_LIST)
                    && ((struct lys_node_list *)src_elem->schema)->keys_size)) && src_elem->child && trg_child) {
                /* go into children */
                src_next = src_elem->child;
                trg_parent = trg_child;
            } else {
src_skip:
                /* no children (or the whole subtree will be inserted), try siblings */
                if (src_elem == src) {
                    /* we are done with this subtree */
                    if (trg_child) {
                        /* it's an empty container, list without keys, or an already-updated leaf/anydata, nothing else to do */
                        break;
                    } else {
                        /* ... but we still need to insert it */
                        src_next = NULL;
                        goto src_insert;
                    }
                } else {
                    src_next = src_elem->next;
                    /* trg_parent does not change */
                }
            }
            while (!src_next) {
                src_elem = src_elem->parent;
                if (src_elem->parent == src->parent) {
                    /* we are done, no next element to process */
                    break;
                }

                /* parent is already processed, go to its sibling */
                src_next = src_elem->next;
                trg_parent = trg_parent->parent;
            }

            if (!trg_child) {
src_insert:
                /* we need to insert the whole subtree */
                if (ctx == src_elem_backup->schema->module->ctx) {
                    /* same context - unlink the subtree and insert it into the target */
                    lyd_unlink(src_elem_backup);
                } else {
                    /* different contexts - before inserting subtree, instead of unlinking, duplicate it into the
                     * target context */
                    src_elem_backup = lyd_dup_to_ctx(src_elem_backup, 1, ctx);
                }

                if (src_elem == source) {
                    /* it will be linked into another data tree and the pointers changed */
                    source = source->next;
                }

                /* insert subtree into the target */
                if (lyd_insert(trg_parent_backup, src_elem_backup)) {
                    LOGINT(ctx);
                    lyd_free_withsiblings(source);
                    return 1;
                }
                if (src_elem == src) {
                    /* we are finished for this src */
                    break;
                }
            }
        }
    }

    lyd_free_withsiblings(source);
    if (clear_flag) {
        return 2;
    }
    return 0;
}